

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O0

Lazy<cinatra::resp_data> __thiscall
cinatra::coro_http_client::async_upload_multipart(coro_http_client *this,string *uri)

{
  bool bVar1;
  undefined8 *puVar2;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 in_RSI;
  LazyBase<cinatra::resp_data,_false> in_RDI;
  req_content_type in_stack_00000604;
  upload_type_t in_stack_00000608;
  http_method in_stack_0000060c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000610;
  coro_http_client *in_stack_00000618;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000650;
  uint64_t in_stack_00000658;
  int64_t in_stack_00000660;
  resp_data *in_stack_fffffffffffffd58;
  resp_data *value;
  LazyPromise<cinatra::resp_data> *in_stack_fffffffffffffd60;
  LazyPromiseBase *in_stack_fffffffffffffd68;
  void *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  basic_string_view<char,_std::char_traits<char>_> abStack_c0 [12];
  
  puVar2 = (undefined8 *)operator_new(0x148,(nothrow_t *)&std::nothrow);
  if (puVar2 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::
    get_return_object_on_allocation_failure();
  }
  else {
    *puVar2 = async_upload_multipart;
    puVar2[1] = async_upload_multipart;
    value = (resp_data *)(puVar2 + 0x14);
    puVar2[0x27] = in_RSI;
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::LazyPromise
              (in_stack_fffffffffffffd60);
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::get_return_object
              ((LazyPromise<cinatra::resp_data> *)
               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)(puVar2 + 2));
    bVar1 = std::suspend_always::await_ready((suspend_always *)((long)puVar2 + 0x145));
    if (bVar1) {
      std::suspend_always::await_resume((suspend_always *)((long)puVar2 + 0x145));
      bVar1 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::multipart_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::multipart_t>_>_>
              ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::multipart_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::multipart_t>_>_>
                       *)0x232d0b);
      if (bVar1) {
        null_logger_t::operator<<((null_logger_t *)&NULL_LOGGER,(char (*) [13])"no multipart");
        std::make_error_code(0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(abStack_c0);
        std::span<cinatra::http_header,_18446744073709551615UL>::span
                  ((span<cinatra::http_header,_18446744073709551615UL> *)0x232d72);
        async_simple::coro::detail::LazyPromise<cinatra::resp_data>::
        return_value<cinatra::resp_data>(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      }
      else {
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        puVar2[0x18] = 0;
        puVar2[0x19] = 0;
        puVar2[0x16] = 0;
        puVar2[0x17] = 0;
        *(undefined8 *)&value->net_err = 0;
        puVar2[0x15] = 0;
        puVar2[0x1a] = 0;
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)0x232dd8);
        in_stack_fffffffffffffd68 = (LazyPromiseBase *)0xffffffffffffffff;
        in_stack_fffffffffffffd60 = (LazyPromise<cinatra::resp_data> *)0x0;
        async_upload_impl<(cinatra::upload_type_t)2,std::__cxx11::string,cinatra::upload_type_t>
                  (in_stack_00000618,in_stack_00000610,in_stack_0000060c,in_stack_00000608,
                   in_stack_00000604,in_stack_00000650,in_stack_00000658,in_stack_00000660);
        async_simple::coro::detail::LazyPromiseBase::
        await_transform<async_simple::coro::Lazy<cinatra::resp_data>>
                  (in_stack_fffffffffffffd68,(Lazy<cinatra::resp_data> *)in_stack_fffffffffffffd60);
        bVar1 = async_simple::coro::detail::LazyAwaiterBase<cinatra::resp_data>::await_ready
                          ((LazyAwaiterBase<cinatra::resp_data> *)(puVar2 + 0x24));
        if (!bVar1) {
          *(undefined1 *)((long)puVar2 + 0x144) = 1;
          async_upload_multipart
                    ((void *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                     (void *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          (*(code *)*extraout_RAX)(extraout_RAX);
          return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
        }
        puVar2[0x23] = (LazyAwaiterBase<cinatra::resp_data> *)(puVar2 + 0x24);
        async_simple::coro::detail::LazyAwaiterBase<cinatra::resp_data>::awaitResume
                  ((LazyAwaiterBase<cinatra::resp_data> *)
                   CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
        async_simple::coro::detail::LazyPromise<cinatra::resp_data>::
        return_value<cinatra::resp_data>(in_stack_fffffffffffffd60,value);
        async_simple::coro::detail::LazyBase<cinatra::resp_data,_false>::ValueAwaiter::~ValueAwaiter
                  ((ValueAwaiter *)0x232f8c);
        async_simple::coro::Lazy<cinatra::resp_data>::~Lazy((Lazy<cinatra::resp_data> *)0x232f99);
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)0x232fa6);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd60);
      }
      async_simple::coro::detail::LazyPromiseBase::final_suspend((LazyPromiseBase *)(puVar2 + 2));
      bVar1 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                        ((FinalAwaiter *)((long)puVar2 + 0x146));
      if (bVar1) {
        async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
                  ((FinalAwaiter *)((long)puVar2 + 0x146));
        async_simple::coro::detail::LazyPromise<cinatra::resp_data>::~LazyPromise
                  ((LazyPromise<cinatra::resp_data> *)0x233140);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd60);
        if (puVar2 != (undefined8 *)0x0) {
          operator_delete(puVar2,0x148);
        }
      }
      else {
        *puVar2 = 0;
        *(undefined1 *)((long)puVar2 + 0x144) = 2;
        async_upload_multipart(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
        (*(code *)*extraout_RAX_00)(extraout_RAX_00);
      }
    }
    else {
      *(undefined1 *)((long)puVar2 + 0x144) = 0;
      async_upload_multipart(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    }
  }
  return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<resp_data> async_upload_multipart(std::string uri) {
    if (form_data_.empty()) {
      CINATRA_LOG_WARNING << "no multipart";
      co_return resp_data{std::make_error_code(std::errc::invalid_argument),
                          404};
    }

    co_return co_await async_upload_impl<upload_type_t::multipart>(
        std::move(uri), http_method::POST, upload_type_t::multipart,
        req_content_type::multipart);
  }